

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9ReadVer(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Io_FileType_t FileType;
  FILE *__stream;
  Abc_Ntk_t *pNtk_00;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint local_64;
  int fVerbose;
  int c;
  int nArgcNew;
  char *pTemp;
  char *pFileName;
  char **pArgvNew;
  FILE *pFile;
  Gia_Man_t *pAig;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_64 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      if (argc - globalUtilOptind == 1) {
        pcVar2 = argv[globalUtilOptind];
        for (_c = pcVar2; *_c != '\0'; _c = _c + 1) {
          if (*_c == '>') {
            *_c = '\\';
          }
        }
        __stream = fopen(pcVar2,"r");
        if (__stream == (FILE *)0x0) {
          Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar2);
          pcVar2 = Extra_FileGetSimilarName(pcVar2,".v",".blif",(char *)0x0,(char *)0x0,(char *)0x0)
          ;
          if (pcVar2 != (char *)0x0) {
            Abc_Print(1,"Did you mean \"%s\"?",pcVar2);
          }
          Abc_Print(1,"\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          fclose(__stream);
          FileType = Io_ReadFileType(pcVar2);
          pNtk_00 = Io_ReadNetlist(pcVar2,FileType,0);
          if (pNtk_00 == (Abc_Ntk_t *)0x0) {
            Abc_Print(-1,"Reading hierarchical Verilog has failed.\n");
            pAbc_local._4_4_ = 1;
          }
          else {
            pNew = Abc_NtkFlattenHierarchyGia(pNtk_00,(Vec_Ptr_t **)0x0,local_64);
            Abc_NtkDelete(pNtk_00);
            Abc_FrameUpdateGia(pAbc,pNew);
            pAbc_local._4_4_ = 0;
          }
        }
      }
      else {
        Abc_Print(-1,"There is no file name.\n");
        pAbc_local._4_4_ = 1;
      }
      return pAbc_local._4_4_;
    }
    if (iVar1 != 0x76) break;
    local_64 = local_64 ^ 1;
  }
  Abc_Print(-2,"usage: &read_ver [-vh] <file>\n");
  Abc_Print(-2,"\t         a specialized reader for hierarchical Verilog files\n");
  pcVar2 = "no";
  if (local_64 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggles additional verbose output [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : the file name\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9ReadVer( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    Gia_Man_t * pAig;
    FILE * pFile;
    char ** pArgvNew;
    char * pFileName, * pTemp;
    int nArgcNew;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }

    // get the input file name
    pFileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = pFileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( pFileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".v", ".blif", NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", pFileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    // read hierarchical Verilog
    pNtk = Io_ReadNetlist( pFileName, Io_ReadFileType(pFileName), 0 );
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Reading hierarchical Verilog has failed.\n" );
        return 1;
    }
    pAig = Abc_NtkFlattenHierarchyGia( pNtk, NULL, fVerbose );
    Abc_NtkDelete( pNtk );
    Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &read_ver [-vh] <file>\n" );
    Abc_Print( -2, "\t         a specialized reader for hierarchical Verilog files\n" );
    Abc_Print( -2, "\t-v     : toggles additional verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}